

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O2

void Omega_h::fill_linear<long>(Write<long> *a,long offset,long stride)

{
  Alloc *pAVar1;
  size_t sVar2;
  type_conflict1 f;
  type_conflict1 local_40;
  
  Write<long>::Write((Write<int> *)&local_40,(Write<int> *)a);
  pAVar1 = (a->shared_alloc_).alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  local_40.offset = offset;
  local_40.stride = stride;
  parallel_for<Omega_h::fill_linear<long>(Omega_h::Write<long>,long,long)::_lambda(int)_1_>
            ((LO)(sVar2 >> 3),&local_40,"Write(size,offset,stride)");
  Write<long>::~Write(&local_40.a);
  return;
}

Assistant:

void fill_linear(Write<T> a, T offset, T stride) {
  auto f = OMEGA_H_LAMBDA(LO i) {
    a[i] = offset + (stride * static_cast<T>(i));
  };
  parallel_for(a.size(), f, "Write(size,offset,stride)");
}